

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  __m256i *__return_storage_ptr__;
  int *piVar1;
  __m256i *palVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong uVar10;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i vWH;
  __m256i vWH_00;
  __m256i vWH_01;
  __m256i vWH_02;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  undefined1 auVar11 [32];
  uint uVar12;
  parasail_result_t *ppVar13;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *piVar14;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar24;
  char *pcVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  int64_t iVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  char *__format;
  __m256i *palVar35;
  ulong uVar36;
  long lVar37;
  int32_t j;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar41 [16];
  undefined1 auVar53 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar67 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined4 in_stack_fffffffffffff9f0;
  uint uVar87;
  int64_t *ptr_08;
  long local_578;
  long lStack_570;
  long lStack_560;
  __m256i_64_t B;
  long local_538;
  long lStack_530;
  long lStack_520;
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [32];
  undefined1 local_418 [32];
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [32];
  undefined1 local_338 [32];
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  undefined1 local_278 [32];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  long local_158;
  long lStack_150;
  long lStack_140;
  int64_t iVar23;
  undefined1 auVar48 [32];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "_s2";
LAB_0077e045:
    fprintf(_stderr,__format,"parasail_nw_stats_table_diag_avx2_256_64",pcVar25);
    return (parasail_result_t *)0x0;
  }
  uVar39 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar25 = "s2Len";
    goto LAB_0077e045;
  }
  uVar10 = CONCAT44(0,open);
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "open";
    goto LAB_0077e045;
  }
  uVar36 = CONCAT44(0,gap);
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar25 = "gap";
    goto LAB_0077e045;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "matrix";
    goto LAB_0077e045;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_nw_stats_table_diag_avx2_256_64");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "_s1";
      goto LAB_0077e045;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar25 = "_s1Len";
      goto LAB_0077e045;
    }
    if (matrix->type == 0) goto LAB_0077cf1a;
  }
  _s1Len = matrix->length;
LAB_0077cf1a:
  iVar16 = matrix->min;
  iVar32 = matrix->max;
  iVar31 = -open;
  uVar27 = 0x8000000000000000 - (long)iVar16;
  if (iVar16 != iVar31 && SBORROW4(iVar16,iVar31) == iVar16 + open < 0) {
    uVar27 = uVar10 | 0x8000000000000000;
  }
  ppVar13 = parasail_result_new_table3(_s1Len,s2Len);
  if (ppVar13 != (parasail_result_t *)0x0) {
    ppVar13->flag = ppVar13->flag | 0x4831001;
    ptr = parasail_memalign_int64_t(0x20,(long)(int)(_s1Len + 3));
    uVar34 = (ulong)(s2Len + 6);
    ptr_00 = parasail_memalign_int64_t(0x20,uVar34);
    ptr_01 = parasail_memalign_int64_t(0x20,uVar34);
    piVar14 = parasail_memalign_int64_t(0x20,uVar34);
    ptr_02 = parasail_memalign_int64_t(0x20,uVar34);
    ptr_03 = parasail_memalign_int64_t(0x20,uVar34);
    ptr_04 = parasail_memalign_int64_t(0x20,uVar34);
    ptr_05 = parasail_memalign_int64_t(0x20,uVar34);
    ptr_06 = parasail_memalign_int64_t(0x20,uVar34);
    ptr_07 = parasail_memalign_int64_t(0x20,uVar34);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = ptr_02;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = ptr_03;
    auVar55 = vpunpcklqdq_avx(auVar55,auVar67);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = ptr_04;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = ptr_05;
    auVar67 = vpunpcklqdq_avx(auVar41,auVar53);
    auVar41 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar55;
    auVar53 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = ptr;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = ptr_00;
    auVar55 = vpunpcklqdq_avx(auVar54,auVar68);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = ptr_01;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = piVar14;
    auVar67 = vpunpcklqdq_avx(auVar69,auVar76);
    auVar55 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar55;
    auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
    auVar65._0_8_ = -(ulong)(auVar55._0_8_ == 0);
    auVar65._8_8_ = -(ulong)(auVar55._8_8_ == 0);
    auVar65._16_8_ = -(ulong)(auVar67._0_8_ == 0);
    auVar65._24_8_ = -(ulong)(auVar67._8_8_ == 0);
    auVar46._0_8_ = -(ulong)(auVar41._0_8_ == 0);
    auVar46._8_8_ = -(ulong)(auVar41._8_8_ == 0);
    auVar46._16_8_ = -(ulong)(auVar53._0_8_ == 0);
    auVar46._24_8_ = -(ulong)(auVar53._8_8_ == 0);
    auVar46 = vpackssdw_avx2(auVar65,auVar46);
    if ((ptr_07 != (int64_t *)0x0 && ptr_06 != (int64_t *)0x0) &&
        ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
              (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            SUB321(auVar46 >> 0x7f,0) == '\0') &&
           (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          SUB321(auVar46 >> 0xbf,0) == '\0') &&
         (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar46[0x1f]))
    {
      uVar12 = s2Len + 3;
      uVar87 = _s1Len - 1;
      iVar16 = s2Len + -1;
      lVar20 = 0x7ffffffffffffffe - (long)iVar32;
      uVar17 = gap * 4;
      auVar47._4_4_ = 0;
      auVar47._0_4_ = uVar17;
      auVar47._8_4_ = uVar17;
      auVar47._12_4_ = 0;
      auVar47._16_4_ = uVar17;
      auVar47._20_4_ = 0;
      auVar47._24_4_ = uVar17;
      auVar47._28_4_ = 0;
      lVar21 = (long)_s1Len;
      lVar24 = lVar21 + -1;
      lVar30 = uVar39 - 1;
      lVar37 = uVar27 + 1;
      auVar42._8_8_ = lVar37;
      auVar42._0_8_ = lVar37;
      auVar48._16_8_ = lVar37;
      auVar48._0_16_ = auVar42;
      auVar48._24_8_ = lVar37;
      auVar55 = vpslldq_avx(auVar42,8);
      auVar49._16_16_ = ZEXT116(1) * auVar55;
      auVar49._0_16_ = ZEXT116(0) * auVar55;
      auVar55 = vpinsrd_avx(ZEXT416((uint)(gap * -3 - open)),iVar31 + gap * -2,1);
      auVar55 = vpinsrd_avx(auVar55,iVar31 - gap,2);
      auVar55 = vpinsrd_avx(auVar55,iVar31,3);
      local_3d8 = vpmovsxdq_avx2(auVar55);
      for (uVar27 = 0; lVar22 = lVar21, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar27;
          uVar27 = uVar27 + 1) {
        ptr[uVar27] = (long)matrix->mapper[(byte)_s1[uVar27]];
      }
      for (; lVar22 < (int)(_s1Len + 3); lVar22 = lVar22 + 1) {
        ptr[lVar22] = 0;
      }
      piVar1 = matrix->mapper;
      for (uVar27 = 0; uVar39 != uVar27; uVar27 = uVar27 + 1) {
        ptr_00[uVar27 + 3] = (long)piVar1[(byte)_s2[uVar27]];
      }
      for (lVar22 = 0; uVar27 = uVar39, lVar22 != 3; lVar22 = lVar22 + 1) {
        ptr_00[lVar22] = 0;
      }
      for (; (int)uVar27 < (int)uVar12; uVar27 = uVar27 + 1) {
        ptr_00[uVar27 + 3] = 0;
      }
      lVar33 = vpextrq_avx(local_3d8._16_16_,1);
      lVar22 = lVar33;
      for (lVar28 = 0; uVar39 * 8 - lVar28 != 0; lVar28 = lVar28 + 8) {
        *(long *)((long)ptr_01 + lVar28 + 0x18) = lVar22;
        *(undefined8 *)((long)piVar14 + lVar28 + 0x18) = 0;
        *(undefined8 *)((long)ptr_02 + lVar28 + 0x18) = 0;
        *(undefined8 *)((long)ptr_03 + lVar28 + 0x18) = 0;
        *(long *)((long)ptr_04 + lVar28 + 0x18) = lVar37;
        *(undefined8 *)((long)ptr_05 + lVar28 + 0x18) = 0;
        *(undefined8 *)((long)ptr_06 + lVar28 + 0x18) = 0;
        *(undefined8 *)((long)ptr_07 + lVar28 + 0x18) = 0;
        lVar22 = lVar22 - uVar36;
      }
      for (lVar22 = 0; lVar22 != 0x18; lVar22 = lVar22 + 8) {
        *(undefined8 *)((long)ptr_01 + lVar22) = 0;
        *(undefined8 *)((long)piVar14 + lVar22) = 0;
        *(undefined8 *)((long)ptr_02 + lVar22) = 0;
        *(undefined8 *)((long)ptr_03 + lVar22) = 0;
        *(undefined8 *)((long)ptr_04 + lVar22) = 0;
        *(undefined8 *)((long)ptr_05 + lVar22) = 0;
        *(undefined8 *)((long)ptr_06 + lVar22) = 0;
        *(undefined8 *)((long)ptr_07 + lVar22) = 0;
      }
      for (lVar22 = 0; s2Len + (int)lVar22 < (int)uVar12; lVar22 = lVar22 + 1) {
        ptr_01[uVar39 + lVar22 + 3] = 0;
        piVar14[uVar39 + lVar22 + 3] = 0;
        ptr_02[uVar39 + lVar22 + 3] = 0;
        ptr_03[uVar39 + lVar22 + 3] = 0;
        ptr_04[uVar39 + lVar22 + 3] = 0;
        ptr_05[uVar39 + lVar22 + 3] = 0;
        ptr_06[uVar39 + lVar22 + 3] = 0;
        ptr_07[uVar39 + lVar22 + 3] = 0;
      }
      ptr_01[2] = 0;
      local_338._8_8_ = 2;
      local_338._0_8_ = 3;
      local_338._16_8_ = 1;
      local_338._24_8_ = 0;
      uVar27 = 0;
      local_2f8._8_8_ = lVar20;
      local_2f8._0_8_ = lVar20;
      local_2f8._16_8_ = lVar20;
      local_2f8._24_8_ = lVar20;
      auVar66 = ZEXT3264(auVar48);
      auVar75 = ZEXT3264(auVar48);
      auVar78 = ZEXT3264(auVar48);
      auVar79 = ZEXT3264(auVar48);
      ptr_08 = piVar14;
      local_318 = auVar48;
      while ((long)uVar27 < lVar21) {
        uVar17 = (uint)uVar27;
        if (matrix->type == 0) {
          uVar34 = ptr[uVar27];
          iVar23 = ptr[uVar27 + 1];
          iVar15 = ptr[uVar27 + 2];
          iVar29 = ptr[uVar27 + 3];
        }
        else {
          uVar18 = uVar17 | 1;
          if (lVar21 <= (long)(uVar27 | 1)) {
            uVar18 = uVar87;
          }
          iVar23 = (int64_t)(int)uVar18;
          uVar18 = uVar17 | 2;
          if (lVar21 <= (long)(uVar27 | 2)) {
            uVar18 = uVar87;
          }
          iVar15 = (int64_t)(int)uVar18;
          uVar18 = uVar17 | 3;
          if (lVar21 <= (long)(uVar27 | 3)) {
            uVar18 = uVar87;
          }
          iVar29 = (int64_t)(int)uVar18;
          uVar34 = uVar27;
        }
        auVar65 = vpermpd_avx2(*(undefined1 (*) [32])(ptr + uVar27),0x1b);
        palVar2 = (__m256i *)matrix->matrix;
        lVar22 = (long)matrix->size;
        __return_storage_ptr__ = (__m256i *)((long)*palVar2 + iVar29 * lVar22 * 4);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = ptr_01[2];
        auVar55 = vpslldq_avx(auVar43,8);
        local_278._16_16_ = ZEXT116(1) * auVar55;
        local_278._0_16_ = ZEXT116(0) * auVar55;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = lVar33 - uVar27 * uVar36;
        auVar55 = vpslldq_avx(auVar44,8);
        in_ZMM10._16_16_ = ZEXT116(1) * auVar55;
        in_ZMM10._0_16_ = ZEXT116(0) * auVar55;
        uVar27 = uVar27 + 4;
        ptr_01[2] = lVar33 - uVar27 * uVar36;
        uStack_210 = 0;
        local_218 = 0;
        uStack_208 = 0;
        uStack_200 = 0;
        local_3b8 = ZEXT1632(ZEXT816(0));
        uStack_250 = 0;
        local_258 = 0;
        uStack_248 = 0;
        uStack_240 = 0;
        auVar86 = ZEXT864(0) << 0x40;
        auVar84 = ZEXT864(0) << 0x40;
        auVar85 = ZEXT864(0) << 0x40;
        auVar81 = ZEXT1664((undefined1  [16])0x0);
        local_498 = auVar81._0_32_;
        auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
        local_418._8_8_ = 0xfffffffffffffffe;
        local_418._0_8_ = 0xfffffffffffffffd;
        local_418._16_8_ = 0xffffffffffffffff;
        local_418._24_8_ = 0;
        local_438._16_8_ = lVar37;
        local_438._0_16_ = auVar42;
        local_438._24_8_ = lVar37;
        palVar35 = palVar2;
        auVar46 = auVar49;
        local_4b8 = auVar49;
        local_478 = local_498;
        local_458 = local_498;
        for (uVar38 = 0; auVar52 = auVar81._0_32_, (~((int)uVar12 >> 0x1f) & uVar12) != uVar38;
            uVar38 = uVar38 + 1) {
          auVar8 = vpermq_avx2(in_ZMM10._0_32_,0xf9);
          iVar29 = ptr_01[uVar38 + 3];
          auVar58._8_8_ = iVar29;
          auVar58._0_8_ = iVar29;
          auVar58._16_8_ = iVar29;
          auVar58._24_8_ = iVar29;
          auVar7 = vpblendd_avx2(auVar8,auVar58,0xc0);
          auVar8 = vpermpd_avx2(auVar86._0_32_,0xf9);
          iVar29 = piVar14[uVar38 + 3];
          auVar59._8_8_ = iVar29;
          auVar59._0_8_ = iVar29;
          auVar59._16_8_ = iVar29;
          auVar59._24_8_ = iVar29;
          auVar58 = vblendpd_avx(auVar8,auVar59,8);
          auVar8 = vpermpd_avx2(auVar84._0_32_,0xf9);
          iVar29 = ptr_02[uVar38 + 3];
          auVar60._8_8_ = iVar29;
          auVar60._0_8_ = iVar29;
          auVar60._16_8_ = iVar29;
          auVar60._24_8_ = iVar29;
          auVar59 = vblendpd_avx(auVar8,auVar60,8);
          auVar8 = vpermpd_avx2(auVar85._0_32_,0xf9);
          iVar29 = ptr_03[uVar38 + 3];
          auVar61._8_8_ = iVar29;
          auVar61._0_8_ = iVar29;
          auVar61._16_8_ = iVar29;
          auVar61._24_8_ = iVar29;
          auVar60 = vblendpd_avx(auVar8,auVar61,8);
          auVar46 = vpermq_avx2(auVar46,0xf9);
          iVar29 = ptr_04[uVar38 + 3];
          auVar62._8_8_ = iVar29;
          auVar62._0_8_ = iVar29;
          auVar62._16_8_ = iVar29;
          auVar62._24_8_ = iVar29;
          auVar46 = vpblendd_avx2(auVar46,auVar62,0xc0);
          auVar8 = vpermpd_avx2(auVar82._0_32_,0xf9);
          iVar29 = ptr_05[uVar38 + 3];
          auVar71._8_8_ = iVar29;
          auVar71._0_8_ = iVar29;
          auVar71._16_8_ = iVar29;
          auVar71._24_8_ = iVar29;
          auVar8 = vblendps_avx(auVar8,auVar71,0xc0);
          auVar9 = vpermq_avx2(auVar52,0xf9);
          iVar29 = ptr_06[uVar38 + 3];
          auVar72._8_8_ = iVar29;
          auVar72._0_8_ = iVar29;
          auVar72._16_8_ = iVar29;
          auVar72._24_8_ = iVar29;
          auVar62 = vpblendd_avx2(auVar9,auVar72,0xc0);
          auVar9 = vpermpd_avx2(auVar83._0_32_,0xf9);
          iVar29 = ptr_07[uVar38 + 3];
          auVar73._8_8_ = iVar29;
          auVar73._0_8_ = iVar29;
          auVar73._16_8_ = iVar29;
          auVar73._24_8_ = iVar29;
          auVar9 = vblendps_avx(auVar9,auVar73,0xc0);
          auVar3._8_4_ = open;
          auVar3._0_8_ = uVar10;
          auVar3._12_4_ = 0;
          auVar3._16_4_ = open;
          auVar3._20_4_ = 0;
          auVar3._24_4_ = open;
          auVar3._28_4_ = 0;
          auVar3 = vpsubq_avx2(auVar7,auVar3);
          auVar4._8_4_ = gap;
          auVar4._0_8_ = uVar36;
          auVar4._12_4_ = 0;
          auVar4._16_4_ = gap;
          auVar4._20_4_ = 0;
          auVar4._24_4_ = gap;
          auVar4._28_4_ = 0;
          auVar4 = vpsubq_avx2(auVar46,auVar4);
          a[1] = (longlong)ptr_03;
          a[0] = (longlong)ptr_04;
          a[2] = (longlong)ptr_02;
          a[3]._0_4_ = in_stack_fffffffffffff9f0;
          a[3]._4_4_ = uVar87;
          b[1] = (longlong)ptr_00;
          b[0] = uVar39;
          b[2] = (longlong)ptr_07;
          b[3] = (longlong)ptr_08;
          auVar46 = auVar3;
          _mm256_max_epi64_rpl(palVar35,a,b);
          auVar61 = vpcmpgtq_avx2(auVar3,auVar4);
          auVar3 = vblendvpd_avx(auVar8,auVar58,auVar61);
          auVar4 = vblendvpd_avx(auVar62,auVar59,auVar61);
          auVar8 = vblendvpd_avx(auVar9,auVar60,auVar61);
          auVar9 = vpcmpeqd_avx2(auVar46,auVar46);
          auVar71 = vpsubq_avx2(auVar8,auVar9);
          auVar8._8_4_ = open;
          auVar8._0_8_ = uVar10;
          auVar8._12_4_ = 0;
          auVar8._16_4_ = open;
          auVar8._20_4_ = 0;
          auVar8._24_4_ = open;
          auVar8._28_4_ = 0;
          auVar8 = vpsubq_avx2(in_ZMM10._0_32_,auVar8);
          auVar9._8_4_ = gap;
          auVar9._0_8_ = uVar36;
          auVar9._12_4_ = 0;
          auVar9._16_4_ = gap;
          auVar9._20_4_ = 0;
          auVar9._24_4_ = gap;
          auVar9._28_4_ = 0;
          auVar9 = vpsubq_avx2(local_4b8,auVar9);
          a_00[1] = (longlong)ptr_03;
          a_00[0] = (longlong)ptr_04;
          a_00[2] = (longlong)ptr_02;
          a_00[3]._0_4_ = in_stack_fffffffffffff9f0;
          a_00[3]._4_4_ = uVar87;
          b_00[1] = (longlong)ptr_00;
          b_00[0] = uVar39;
          b_00[2] = (longlong)ptr_07;
          b_00[3] = (longlong)ptr_08;
          auVar73 = auVar8;
          _mm256_max_epi64_rpl(palVar35,a_00,b_00);
          auVar8 = vpcmpgtq_avx2(auVar8,auVar9);
          auVar61 = vblendvpd_avx(local_458,auVar86._0_32_,auVar8);
          auVar62 = vblendvpd_avx(local_478,auVar84._0_32_,auVar8);
          auVar8 = vblendvpd_avx(local_498,auVar85._0_32_,auVar8);
          auVar72 = vpsubq_avx2(auVar8,_DAT_008a5a80);
          auVar8 = vpermq_avx2(local_438,0xf9);
          lVar28 = ptr_00[uVar38 + 3];
          auVar63._8_8_ = lVar28;
          auVar63._0_8_ = lVar28;
          auVar63._16_8_ = lVar28;
          auVar63._24_8_ = lVar28;
          local_438 = vpblendd_avx2(auVar8,auVar63,0xc0);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = (long)*(int *)((long)*palVar2 + lVar28 * 4 + uVar34 * lVar22 * 4);
          auVar56._8_8_ = 0;
          auVar56._0_8_ =
               (long)*(int *)((long)*palVar2 + ptr_00[uVar38 + 2] * 4 + iVar23 * lVar22 * 4);
          auVar55 = vpunpcklqdq_avx(auVar56,auVar45);
          auVar57._8_8_ = 0;
          auVar57._0_8_ =
               (long)*(int *)((long)*palVar2 + ptr_00[uVar38 + 1] * 4 + iVar15 * lVar22 * 4);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = (long)*(int *)((long)*__return_storage_ptr__ + ptr_00[uVar38] * 4);
          auVar67 = vpunpcklqdq_avx(auVar70,auVar57);
          auVar50._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar67;
          auVar50._16_16_ = ZEXT116(1) * auVar55;
          auVar8 = vpaddq_avx2(auVar50,local_278);
          a_01[1] = (longlong)ptr_03;
          a_01[0] = (longlong)ptr_04;
          a_01[2] = (longlong)ptr_02;
          a_01[3]._0_4_ = in_stack_fffffffffffff9f0;
          a_01[3]._4_4_ = uVar87;
          b_01[1] = (longlong)ptr_00;
          b_01[0] = uVar39;
          b_01[2] = (longlong)ptr_07;
          b_01[3] = (longlong)ptr_08;
          palVar35 = __return_storage_ptr__;
          auVar63 = auVar8;
          _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
          a_02[1] = (longlong)ptr_03;
          a_02[0] = (longlong)ptr_04;
          a_02[2] = (longlong)ptr_02;
          a_02[3]._0_4_ = in_stack_fffffffffffff9f0;
          a_02[3]._4_4_ = uVar87;
          b_02[1] = (longlong)ptr_00;
          b_02[0] = uVar39;
          b_02[2] = (longlong)ptr_07;
          b_02[3] = (longlong)ptr_08;
          _mm256_max_epi64_rpl(palVar35,a_02,b_02);
          local_578 = auVar8._0_8_;
          auVar64._0_8_ = -(ulong)(auVar63._0_8_ == local_578);
          lStack_570 = auVar8._8_8_;
          auVar64._8_8_ = -(ulong)(auVar63._8_8_ == lStack_570);
          auVar64._16_8_ = -(ulong)(auVar63._16_8_ == auVar8._16_8_);
          lStack_560 = auVar8._24_8_;
          auVar64._24_8_ = -(ulong)(auVar63._24_8_ == lStack_560);
          local_538 = auVar46._0_8_;
          auVar74._0_8_ = -(ulong)(auVar63._0_8_ == local_538);
          lStack_530 = auVar46._8_8_;
          auVar74._8_8_ = -(ulong)(auVar63._8_8_ == lStack_530);
          auVar74._16_8_ = -(ulong)(auVar63._16_8_ == auVar46._16_8_);
          lStack_520 = auVar46._24_8_;
          auVar74._24_8_ = -(ulong)(auVar63._24_8_ == lStack_520);
          local_158 = auVar65._0_8_;
          auVar77._0_8_ = -(ulong)(local_438._0_8_ == local_158);
          lStack_150 = auVar65._8_8_;
          auVar77._8_8_ = -(ulong)(local_438._8_8_ == lStack_150);
          auVar77._16_8_ = -(ulong)(local_438._16_8_ == auVar65._16_8_);
          lStack_140 = auVar65._24_8_;
          auVar77._24_8_ = -(ulong)(local_438._24_8_ == lStack_140);
          auVar5._8_8_ = uStack_210;
          auVar5._0_8_ = local_218;
          auVar5._16_8_ = uStack_208;
          auVar5._24_8_ = uStack_200;
          auVar9 = vpsubq_avx2(auVar5,auVar77);
          auVar8 = vblendvpd_avx(auVar61,auVar3,auVar74);
          auVar8 = vblendvpd_avx(auVar8,auVar9,auVar64);
          auVar9 = vpcmpgtq_avx2(auVar50,_DAT_008a5840);
          auVar5 = vpsubq_avx2(local_3b8,auVar9);
          auVar9 = vblendvpd_avx(auVar62,auVar4,auVar74);
          auVar9 = vblendvpd_avx(auVar9,auVar5,auVar64);
          auVar5 = vblendvpd_avx(auVar72,auVar71,auVar74);
          auVar6._8_8_ = uStack_250;
          auVar6._0_8_ = local_258;
          auVar6._16_8_ = uStack_248;
          auVar6._24_8_ = uStack_240;
          auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
          auVar6 = vpsubq_avx2(auVar6,auVar52);
          auVar5 = vblendvpd_avx(auVar5,auVar6,auVar64);
          auVar80._0_8_ = -(ulong)(auVar52._0_8_ == local_418._0_8_);
          auVar80._8_8_ = -(ulong)(auVar52._8_8_ == local_418._8_8_);
          auVar80._16_8_ = -(ulong)(auVar52._16_8_ == local_418._16_8_);
          auVar80._24_8_ = -(ulong)(auVar52._24_8_ == local_418._24_8_);
          auVar6 = vblendvpd_avx(auVar63,local_3d8,auVar80);
          auVar52 = vandnpd_avx(auVar80,auVar8);
          auVar8 = vandnpd_avx(auVar80,auVar9);
          auVar9 = vandnpd_avx(auVar80,auVar5);
          piVar14 = ptr_08;
          if (3 < uVar38) {
            auVar5 = vpcmpgtq_avx2(auVar6,local_2f8);
            local_2f8 = vblendvpd_avx(auVar6,local_2f8,auVar5);
            a_03[1] = (longlong)ptr_03;
            a_03[0] = (longlong)ptr_04;
            a_03[2] = (longlong)ptr_02;
            a_03[3]._0_4_ = in_stack_fffffffffffff9f0;
            a_03[3]._4_4_ = uVar87;
            b_03[1] = (longlong)ptr_00;
            b_03[0] = uVar39;
            b_03[2] = (longlong)ptr_07;
            b_03[3] = (longlong)ptr_08;
            _mm256_max_epi64_rpl(palVar35,a_03,b_03);
            a_04[1] = (longlong)ptr_03;
            a_04[0] = (longlong)ptr_04;
            a_04[2] = (longlong)ptr_02;
            a_04[3]._0_4_ = in_stack_fffffffffffff9f0;
            a_04[3]._4_4_ = uVar87;
            b_04[1] = (longlong)ptr_00;
            b_04[0] = uVar39;
            b_04[2] = (longlong)ptr_07;
            b_04[3] = (longlong)ptr_08;
            _mm256_max_epi64_rpl(palVar35,a_04,b_04);
            a_05[1] = (longlong)ptr_03;
            a_05[0] = (longlong)ptr_04;
            a_05[2] = (longlong)ptr_02;
            a_05[3]._0_4_ = in_stack_fffffffffffff9f0;
            a_05[3]._4_4_ = uVar87;
            b_05[1] = (longlong)ptr_00;
            b_05[0] = uVar39;
            b_05[2] = (longlong)ptr_07;
            b_05[3] = (longlong)ptr_08;
            _mm256_max_epi64_rpl(palVar35,a_05,b_05);
            a_06[1] = (longlong)ptr_03;
            a_06[0] = (longlong)ptr_04;
            a_06[2] = (longlong)ptr_02;
            a_06[3]._0_4_ = in_stack_fffffffffffff9f0;
            a_06[3]._4_4_ = uVar87;
            b_06[1] = (longlong)ptr_00;
            b_06[0] = uVar39;
            b_06[2] = (longlong)ptr_07;
            b_06[3] = (longlong)ptr_08;
            _mm256_max_epi64_rpl(palVar35,a_06,b_06);
            a_07[1] = (longlong)ptr_03;
            a_07[0] = (longlong)ptr_04;
            a_07[2] = (longlong)ptr_02;
            a_07[3]._0_4_ = in_stack_fffffffffffff9f0;
            a_07[3]._4_4_ = uVar87;
            b_07[1] = (longlong)ptr_00;
            b_07[0] = uVar39;
            b_07[2] = (longlong)ptr_07;
            b_07[3] = (longlong)ptr_08;
            _mm256_max_epi64_rpl(palVar35,a_07,b_07);
            piVar14 = ptr_08;
          }
          local_4b8 = vblendvpd_avx(auVar73,auVar48,auVar80);
          local_458 = vandnpd_avx(auVar80,auVar61);
          local_478 = vandnpd_avx(auVar80,auVar62);
          local_498 = vandnpd_avx(auVar80,auVar72);
          j = (int32_t)uVar38;
          vWH[1] = (longlong)ptr_03;
          vWH[0] = (longlong)ptr_04;
          vWH[2] = (longlong)ptr_02;
          vWH[3]._0_4_ = in_stack_fffffffffffff9f0;
          vWH[3]._4_4_ = uVar87;
          arr_store_si256(*((ppVar13->field_4).trace)->trace_del_table,vWH,uVar17,_s1Len,j,
                          (int32_t)uVar39);
          vWH_00[1] = (longlong)ptr_03;
          vWH_00[0] = (longlong)ptr_04;
          vWH_00[2] = (longlong)ptr_02;
          vWH_00[3]._0_4_ = in_stack_fffffffffffff9f0;
          vWH_00[3]._4_4_ = uVar87;
          arr_store_si256(*(int **)((long)((ppVar13->field_4).trace)->trace_del_table + 8),vWH_00,
                          uVar17,_s1Len,j,s2Len);
          vWH_01[1] = (longlong)ptr_03;
          vWH_01[0] = (longlong)ptr_04;
          vWH_01[2] = (longlong)ptr_02;
          vWH_01[3]._0_4_ = in_stack_fffffffffffff9f0;
          vWH_01[3]._4_4_ = uVar87;
          arr_store_si256(*(int **)((long)((ppVar13->field_4).trace)->trace_del_table + 0x10),vWH_01
                          ,uVar17,_s1Len,j,s2Len);
          palVar35 = *(__m256i **)((long)((ppVar13->field_4).trace)->trace_del_table + 0x18);
          vWH_02[1] = (longlong)ptr_03;
          vWH_02[0] = (longlong)ptr_04;
          vWH_02[2] = (longlong)ptr_02;
          vWH_02[3]._0_4_ = in_stack_fffffffffffff9f0;
          vWH_02[3]._4_4_ = uVar87;
          arr_store_si256((int *)palVar35,vWH_02,uVar17,_s1Len,j,s2Len);
          in_ZMM10 = ZEXT3264(auVar6);
          auVar51._0_8_ = -(ulong)(local_418._0_8_ == lVar30);
          auVar51._8_8_ = -(ulong)(local_418._8_8_ == lVar30);
          auVar51._16_8_ = -(ulong)(local_418._16_8_ == lVar30);
          auVar51._24_8_ = -(ulong)(local_418._24_8_ == lVar30);
          auVar11._8_8_ = -(ulong)(local_338._8_8_ == lVar24);
          auVar11._0_8_ = -(ulong)(local_338._0_8_ == lVar24);
          auVar11._16_8_ = -(ulong)(local_338._16_8_ == lVar24);
          auVar11._24_8_ = -(ulong)(local_338._24_8_ == lVar24);
          auVar62 = vpand_avx2(auVar51,auVar11);
          auVar61 = vblendvpd_avx(auVar66._0_32_,auVar6,auVar62);
          auVar66 = ZEXT3264(auVar61);
          auVar86 = ZEXT3264(auVar52);
          auVar61 = vblendvpd_avx(auVar75._0_32_,auVar52,auVar62);
          auVar75 = ZEXT3264(auVar61);
          auVar61 = vblendvpd_avx(auVar78._0_32_,auVar8,auVar62);
          auVar78 = ZEXT3264(auVar61);
          auVar61 = vblendvpd_avx(auVar79._0_32_,auVar9,auVar62);
          auVar79 = ZEXT3264(auVar61);
          ptr_01[uVar38] = auVar6._0_8_;
          iVar29 = vmovlpd_avx(auVar52._0_16_);
          piVar14[uVar38] = iVar29;
          iVar29 = vmovlpd_avx(auVar8._0_16_);
          ptr_02[uVar38] = iVar29;
          auVar84 = ZEXT3264(auVar8);
          iVar29 = vmovlpd_avx(auVar9._0_16_);
          ptr_03[uVar38] = iVar29;
          auVar85 = ZEXT3264(auVar9);
          ptr_04[uVar38] = local_538;
          auVar82 = ZEXT3264(auVar3);
          iVar29 = vmovlps_avx(auVar3._0_16_);
          ptr_05[uVar38] = iVar29;
          auVar81 = ZEXT3264(auVar4);
          ptr_06[uVar38] = auVar4._0_8_;
          auVar83 = ZEXT3264(auVar71);
          iVar29 = vmovlps_avx(auVar71._0_16_);
          ptr_07[uVar38] = iVar29;
          local_418 = vpsubq_avx2(local_418,_DAT_008a5a80);
          local_218 = auVar58._0_8_;
          uStack_210 = auVar58._8_8_;
          uStack_208 = auVar58._16_8_;
          uStack_200 = auVar58._24_8_;
          local_258 = auVar60._0_8_;
          uStack_250 = auVar60._8_8_;
          uStack_248 = auVar60._16_8_;
          uStack_240 = auVar60._24_8_;
          ptr_08 = piVar14;
          local_3b8 = auVar59;
          local_278 = auVar7;
        }
        auVar52._8_8_ = 4;
        auVar52._0_8_ = 4;
        auVar52._16_8_ = 4;
        auVar52._24_8_ = 4;
        local_338 = vpaddq_avx2(local_338,auVar52);
        local_3d8 = vpsubq_avx2(local_3d8,auVar47);
      }
      iVar32 = 4;
      lVar24 = lVar37;
      lVar30 = lVar37;
      lVar21 = lVar37;
      while( true ) {
        iVar26 = (int)lVar30;
        iVar19 = (int)lVar24;
        iVar31 = (int)lVar37;
        bVar40 = iVar32 == 0;
        iVar32 = iVar32 + -1;
        if (bVar40) break;
        lVar22 = vpextrq_avx(auVar66._16_16_,1);
        if (lVar21 < lVar22) {
          lVar37 = vpextrq_avx(auVar75._16_16_,1);
          lVar24 = vpextrq_avx(auVar78._16_16_,1);
          lVar30 = vpextrq_avx(auVar79._16_16_,1);
          lVar21 = lVar22;
        }
        auVar65 = auVar66._0_32_;
        auVar46 = vperm2i128_avx2(auVar65,auVar65,8);
        auVar46 = vpalignr_avx2(auVar65,auVar46,8);
        auVar66 = ZEXT3264(auVar46);
        auVar65 = auVar75._0_32_;
        auVar46 = vperm2i128_avx2(auVar65,auVar65,8);
        auVar46 = vpalignr_avx2(auVar65,auVar46,8);
        auVar75 = ZEXT3264(auVar46);
        auVar65 = auVar78._0_32_;
        auVar46 = vperm2i128_avx2(auVar65,auVar65,8);
        auVar46 = vpalignr_avx2(auVar65,auVar46,8);
        auVar78 = ZEXT3264(auVar46);
        auVar65 = auVar79._0_32_;
        auVar46 = vperm2i128_avx2(auVar65,auVar65,8);
        auVar46 = vpalignr_avx2(auVar65,auVar46,8);
        auVar79 = ZEXT3264(auVar46);
      }
      auVar46 = vpcmpgtq_avx2(auVar48,local_2f8);
      auVar7._8_8_ = lVar20;
      auVar7._0_8_ = lVar20;
      auVar7._16_8_ = lVar20;
      auVar7._24_8_ = lVar20;
      auVar65 = vpcmpgtq_avx2(local_318,auVar7);
      auVar46 = vpor_avx2(auVar65,auVar46);
      if ((((auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           SUB321(auVar46 >> 0x7f,0) != '\0') || SUB321(auVar46 >> 0xbf,0) != '\0') ||
          auVar46[0x1f] < '\0') {
        *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
        lVar21 = 0;
        iVar31 = 0;
        iVar19 = 0;
        iVar26 = 0;
        iVar16 = 0;
        uVar87 = 0;
      }
      ppVar13->score = (int)lVar21;
      ppVar13->end_query = uVar87;
      ppVar13->end_ref = iVar16;
      ((ppVar13->field_4).stats)->matches = iVar31;
      ((ppVar13->field_4).stats)->similar = iVar19;
      ((ppVar13->field_4).stats)->length = iVar26;
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_08);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar13;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vNegInf0;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vNegInf0 = _mm256_insert_epi64_rpl(vZero, NEG_LIMIT, 3);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vGapN = _mm256_set1_epi64x_rpl(gap*N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm256_sub_epi64(vILimit, vOne);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm256_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm256_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i vNH = vZero;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vZero;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf0;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf0;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm256_insert_epi64_rpl(vNH, H_pr[-1], 3);
        vWH = _mm256_insert_epi64_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi64(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi64(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
        vIBoundary = _mm256_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
            similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
            length= (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
        }
        vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
        vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
        vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}